

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rr.cpp
# Opt level: O0

void __thiscall pg::RRSolver::run(RRSolver *this)

{
  pointer piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong *puVar13;
  int *piVar14;
  vector<int,_std::allocator<int>_> *this_00;
  ostream *poVar15;
  vector<int,_std::allocator<int>_> *pvVar16;
  ulong uVar17;
  int local_64;
  vector<int,_std::allocator<int>_> *local_48;
  uint local_24;
  int res;
  int p;
  int i;
  int i_2;
  int i_1;
  int max_prio;
  RRSolver *this_local;
  
  lVar10 = Solver::nodecount((Solver *)this);
  iVar8 = Solver::priority((Solver *)this,(int)lVar10 + -1);
  uVar11 = (ulong)(iVar8 + 1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar11;
  uVar12 = SUB168(auVar2 * ZEXT816(0x18),0);
  uVar17 = uVar12 + 8;
  if (SUB168(auVar2 * ZEXT816(0x18),8) != 0 || 0xfffffffffffffff7 < uVar12) {
    uVar17 = 0xffffffffffffffff;
  }
  puVar13 = (ulong *)operator_new__(uVar17);
  *puVar13 = uVar11;
  pvVar16 = (vector<int,_std::allocator<int>_> *)(puVar13 + 1);
  if (uVar11 != 0) {
    local_48 = pvVar16;
    do {
      std::vector<int,_std::allocator<int>_>::vector(local_48);
      local_48 = local_48 + 1;
    } while (local_48 != pvVar16 + uVar11);
  }
  (this->super_PPSolver).regions = pvVar16;
  uVar11 = Solver::nodecount((Solver *)this);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar11;
  uVar11 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  piVar14 = (int *)operator_new__(uVar11);
  (this->super_PPSolver).region = piVar14;
  uVar11 = Solver::nodecount((Solver *)this);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar11;
  uVar11 = SUB168(auVar4 * ZEXT816(4),0);
  if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  piVar14 = (int *)operator_new__(uVar11);
  (this->super_PPSolver).strategy = piVar14;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (long)(iVar8 + 1);
  uVar11 = SUB168(auVar5 * ZEXT816(4),0);
  if (SUB168(auVar5 * ZEXT816(4),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  piVar14 = (int *)operator_new__(uVar11);
  (this->super_PPSolver).inverse = piVar14;
  for (i = 0; lVar10 = Solver::nodecount((Solver *)this), i < lVar10; i = i + 1) {
    bVar6 = bitset::operator[]((this->super_PPSolver).super_Solver.disabled,(long)i);
    if (bVar6) {
      local_64 = -2;
    }
    else {
      local_64 = Solver::priority((Solver *)this,i);
    }
    (this->super_PPSolver).region[i] = local_64;
  }
  for (p = 0; lVar10 = Solver::nodecount((Solver *)this), p < lVar10; p = p + 1) {
    (this->super_PPSolver).strategy[p] = -1;
  }
  lVar10 = Solver::nodecount((Solver *)this);
  res = (int)lVar10 + -1;
  (this->super_PPSolver).promotions = 0;
LAB_001decb8:
  while (-1 < res) {
    local_24 = Solver::priority((Solver *)this,res);
    while( true ) {
      bVar6 = false;
      if (-1 < res) {
        uVar9 = Solver::priority((Solver *)this,res);
        bVar6 = false;
        if (uVar9 == local_24) {
          bVar7 = bitset::operator[]((this->super_PPSolver).super_Solver.disabled,(long)res);
          bVar6 = true;
          if (!bVar7) {
            bVar6 = (int)local_24 < (this->super_PPSolver).region[res];
          }
        }
      }
      if (!bVar6) break;
      res = res + -1;
    }
    if (res < 0) break;
    uVar9 = Solver::priority((Solver *)this,res);
    if (uVar9 == local_24) {
      (this->super_PPSolver).inverse[(int)local_24] = res;
      iVar8 = (*(this->super_PPSolver).super_Solver._vptr_Solver[5])(this,(ulong)local_24);
      bVar6 = PPSolver::setupRegion
                        (&this->super_PPSolver,res,local_24,(bool)(((byte)iVar8 ^ 0xff) & 1));
      if (bVar6) {
        while( true ) {
          if (1 < (this->super_PPSolver).super_Solver.trace) {
            PPSolver::reportRegion(&this->super_PPSolver,local_24);
          }
          uVar9 = (*(this->super_PPSolver).super_Solver._vptr_Solver[4])
                            (this,(ulong)(uint)res,(ulong)local_24);
          if (uVar9 == 0xfffffffe) goto LAB_001dee06;
          if (uVar9 == 0xffffffff) break;
          if (1 < (this->super_PPSolver).super_Solver.trace) {
            PPSolver::printState(&this->super_PPSolver);
          }
          PPSolver::promote(&this->super_PPSolver,local_24,uVar9);
          if (1 < (this->super_PPSolver).super_Solver.trace) {
            PPSolver::printState(&this->super_PPSolver);
          }
          res = (this->super_PPSolver).inverse[(int)uVar9];
          local_24 = uVar9;
        }
        PPSolver::setDominion(&this->super_PPSolver,local_24);
        lVar10 = Solver::nodecount((Solver *)this);
        res = (int)lVar10 + -1;
      }
      else {
        while( true ) {
          bVar6 = false;
          if (-1 < res) {
            uVar9 = Solver::priority((Solver *)this,res);
            bVar6 = uVar9 == local_24;
          }
          if (!bVar6) break;
          res = res + -1;
        }
      }
    }
    else {
      bVar6 = std::vector<int,_std::allocator<int>_>::empty
                        ((this->super_PPSolver).regions + (int)local_24);
      if (!bVar6) {
        PPSolver::resetRegion(&this->super_PPSolver,local_24);
      }
    }
  }
  pvVar16 = (this->super_PPSolver).regions;
  if (pvVar16 != (vector<int,_std::allocator<int>_> *)0x0) {
    piVar1 = pvVar16[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    this_00 = pvVar16 + (long)piVar1;
    while (pvVar16 != this_00) {
      this_00 = this_00 + -1;
      std::vector<int,_std::allocator<int>_>::~vector(this_00);
    }
    operator_delete__(&pvVar16[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,(long)piVar1 * 0x18 + 8);
  }
  piVar14 = (this->super_PPSolver).region;
  if (piVar14 != (int *)0x0) {
    operator_delete__(piVar14);
  }
  piVar14 = (this->super_PPSolver).strategy;
  if (piVar14 != (int *)0x0) {
    operator_delete__(piVar14);
  }
  piVar14 = (this->super_PPSolver).inverse;
  if (piVar14 != (int *)0x0) {
    operator_delete__(piVar14);
  }
  poVar15 = std::operator<<((this->super_PPSolver).super_Solver.logger,"solved with ");
  poVar15 = (ostream *)std::ostream::operator<<(poVar15,(this->super_PPSolver).promotions);
  poVar15 = std::operator<<(poVar15," promotions.");
  std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
  return;
LAB_001dee06:
  while( true ) {
    bVar6 = false;
    if (-1 < res) {
      uVar9 = Solver::priority((Solver *)this,res);
      bVar6 = uVar9 == local_24;
    }
    if (!bVar6) break;
    res = res + -1;
  }
  goto LAB_001decb8;
}

Assistant:

void
RRSolver::run()
{
    // obtain highest priority and allocate arrays
    int max_prio = priority(nodecount()-1);
    regions = new std::vector<int>[max_prio+1];
    region = new int[nodecount()];
    strategy = new int[nodecount()];
    inverse = new int[max_prio+1];

    // initialize arrays
    for (int i=0; i<nodecount(); i++) region[i] = disabled[i] ? -2 : priority(i);
    for (int i=0; i<nodecount(); i++) strategy[i] = -1;

    // start loop at last node (highest priority)
    int i = nodecount() - 1;

    // reset statistics
    promotions = 0;

    /**
     * Two loops: the outer (normal) loop, and the inner (promotion-chain) loop.
     * The outer loop does region setup and attractor on the full region.
     * The inner loop only attracts from the promoted region.
     */

    while (i >= 0) {
        // get current priority and skip all disabled/attracted nodes
        int p = priority(i);
        while (i >= 0 and priority(i) == p and (disabled[i] or region[i] > p)) i--;
        if (i < 0) break;

        // if empty, possibly reset and continue with next
        if (priority(i) != p) {
            if (!regions[p].empty()) resetRegion(p);
            continue;
        }

        inverse[p] = i;

        // RR: only reset the region if:
        // - current node is promoted or attracted
        // - or region is empty
        // - or region does not fulfill conditions
        // This is checked by checkRegion()
        if (setupRegion(i, p, !checkRegion(p))) {
            // region not empty, maybe promote
            while (true) {
                if (trace >= 2) reportRegion(p);
                int res = getRegionStatus(i, p);
                if (res == -2) {
                    // not closed, skip to next priority and break inner loop
                    while (i >= 0 and priority(i) == p) i--;
                    break;
                } else if (res == -1) {
                    // found dominion, return
                    setDominion(p);
                    // restart algorithm and break inner loop
                    i = nodecount() - 1;
                    break;
                } else {
                    // found promotion, promote
                    if (trace >= 2) printState();
                    promote(p, res);
                    if (trace >= 2) printState();
                    // continue inner loop with the higher priority
                    i = inverse[res];
                    p = res;
                }
            }
        } else {
            // skip to next priority
            while (i >= 0 and priority(i) == p) i--;
        }
    }

    delete[] regions;
    delete[] region;
    delete[] strategy;
    delete[] inverse;

    logger << "solved with " << promotions << " promotions." << std::endl;
}